

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::defineModifiables(Graph *this)

{
  int *piVar1;
  Vertex *pVVar2;
  Edge *pEVar3;
  Vertex *pVVar4;
  Vertex *pVVar5;
  int iVar6;
  int iVar7;
  Edge *pEVar8;
  Edge **ppEVar9;
  Graph *pGVar10;
  int iVar11;
  
  resetModifiables(this);
  iVar6 = this->edgesSize / 2;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  iVar11 = 1;
  for (iVar7 = 0; pGVar10 = this, iVar7 != iVar6; iVar7 = iVar7 + 1) {
    while (pVVar2 = pGVar10->verticesList, pVVar2 != (Vertex *)0x0) {
      ppEVar9 = &pVVar2->edgesList;
      while (pEVar3 = *ppEVar9, pEVar3 != (Edge *)0x0) {
        pVVar4 = pEVar3->destiny;
        if (((pVVar4->auxDegree == 1) && (pEVar3->closed == true)) && (pEVar3->modifiable == true))
        {
          pEVar3->modifiable = false;
          pEVar3->closed = true;
          pVVar5 = pEVar3->origin;
          pEVar8 = findEdge(this,pVVar4->id,pVVar5->id);
          pEVar8->modifiable = false;
          piVar1 = &pVVar5->auxDegree;
          *piVar1 = *piVar1 + -1;
          pVVar4->auxDegree = pVVar4->auxDegree + -1;
          iVar11 = iVar11 + 1;
        }
        ppEVar9 = &pEVar3->nextEdge;
      }
      pGVar10 = (Graph *)&pVVar2->nextVertex;
    }
  }
  this->numberOfNonModifiable = iVar11;
  return;
}

Assistant:

void Graph::defineModifiables(){

    this->resetModifiables();//define todos os arcos como sendo modificaveis
    int n=1;
    for(int i=0; i<this->edgesSize/2; i++){

        //procura arcos que conectam nos folha, esses arcos nao sao modificaveis(nao podem ser abertos)
        for(Vertex *no=this->verticesList; no!=NULL; no= no->getNext()){
            for(Edge *e= no->getEdgesList(); e!=NULL; e= e->getNext()){

                if(e->getDestiny()->getAuxDegree()==1 && e->isClosed()==true && e->getModifiable()==true){

//                    printf("\ndefinindo como nao modif A{%d}...", a->getID());

                    e->setModifiable(false);
		    e->setSwitch(true);//nao modificavel: chave sempre fechad

                    Edge *e_reverse = this->findEdge(e->getDestiny()->getID(), e->getOrigin()->getID());
                    e_reverse->setModifiable(false);

                    e->getOrigin()->setAuxDegree(e->getOrigin()->getAuxDegree() - 1);
                    e->getDestiny()->setAuxDegree(e->getDestiny()->getAuxDegree() - 1);

//                  printf("Modificaveis definidos!");

                    n++;
                }
            }
        }
    }
    this->numberOfNonModifiable = n;
//    printf("\ndefiniu arestas modificaveis!");
}